

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EtherCATStack.cpp
# Opt level: O0

EC_T_DWORD ecatNotifyCallback(EC_T_DWORD dwCode,EC_T_NOTIFYPARMS *pParms)

{
  CEmNotification *pNotifyInstance;
  EC_T_DWORD dwRetVal;
  EC_T_NOTIFYPARMS *pParms_local;
  EC_T_DWORD dwCode_local;
  
  if ((pParms == (EC_T_NOTIFYPARMS *)0x0) || (pParms->pCallerData == (void *)0x0)) {
    pNotifyInstance._4_4_ = 0x9811000b;
  }
  else if ((dwCode < 0x80000) || (0x8ffff < dwCode)) {
    pNotifyInstance._4_4_ =
         CEmNotification::ecatNotify((CEmNotification *)pParms->pCallerData,dwCode,pParms);
  }
  else {
    pNotifyInstance._4_4_ = myAppNotify(dwCode - 0x80000,pParms);
  }
  return pNotifyInstance._4_4_;
}

Assistant:

static EC_T_DWORD ecatNotifyCallback(
    EC_T_DWORD         dwCode,  /**< [in]   Notification code */
    EC_T_NOTIFYPARMS*  pParms   /**< [in]   Notification parameters */
                                         )
{
    EC_T_DWORD         dwRetVal                = EC_E_NOERROR;
    CEmNotification*   pNotifyInstance;

    if ((EC_NULL == pParms)||(EC_NULL==pParms->pCallerData))
    {
        dwRetVal = EC_E_INVALIDPARM;
        goto Exit;
    }

    /* notification for application ? */
    if ((dwCode >= EC_NOTIFY_APP) && (dwCode <= EC_NOTIFY_APP+EC_NOTIFY_APP_MAX_CODE))
    {
        /*****************************************************/
        /* Demo code: Remove/change this in your application */
        /* to get here the API ecatNotifyApp(dwCode, pParms) has to be called */
        /*****************************************************/
        dwRetVal = myAppNotify(dwCode-EC_NOTIFY_APP, pParms);
    }
    else
    {
        pNotifyInstance = (CEmNotification*)pParms->pCallerData;

        /* call the default handler */
        dwRetVal = pNotifyInstance->ecatNotify(dwCode, pParms);
    }

Exit:
    return dwRetVal;
}